

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_Warp(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  double xofs;
  double yofs;
  double zofs;
  void *pvVar1;
  double heightoffset;
  double radiusoffset;
  void *pvVar2;
  uint flags;
  AActor *defactor;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  undefined4 extraout_var_00;
  FState *val;
  VMValue *pVVar9;
  AActor *reference;
  int pos;
  char *pcVar10;
  bool bVar11;
  DAngle local_40;
  DAngle local_38;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_003dbe5f:
      pcVar10 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003dbeb2;
    }
    defactor = (AActor *)(param->field_0).field_1.a;
    if (defactor != (AActor *)0x0) {
      if ((defactor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(defactor->super_DThinker).super_DObject._vptr_DObject)(defactor);
        (defactor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar8 = (defactor->super_DThinker).super_DObject.Class;
      bVar11 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar4 && bVar11) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar11 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar4) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (!bVar11) {
        pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003dbeb2;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_003dbe5f;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar7 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar3[1];
        bVar11 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar4 && bVar11) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar11 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar4) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar11) {
          pcVar10 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003dbeb2;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar10 = "(paramnum) < numparam";
LAB_003dbe8a:
            __assert_fail(pcVar10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1528,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          if (param[3].field_0.field_3.Type != '\0') {
            pcVar10 = "param[paramnum].Type == REGT_INT";
            goto LAB_003dbe8a;
          }
          iVar5 = param[3].field_0.i;
          if (numparam < 5) {
            pVVar9 = defaultparam->Array;
            if (pVVar9[4].field_0.field_3.Type != '\x01') {
              pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003dbef0;
            }
          }
          else {
            pVVar9 = param;
            if (param[4].field_0.field_3.Type != '\x01') {
              pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dbef0:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1529,
                            "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          xofs = pVVar9[4].field_0.f;
          if (numparam < 6) {
            pVVar9 = defaultparam->Array;
            if (pVVar9[5].field_0.field_3.Type != '\x01') {
              pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003dbf0f;
            }
          }
          else {
            pVVar9 = param;
            if (param[5].field_0.field_3.Type != '\x01') {
              pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dbf0f:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x152a,
                            "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          yofs = pVVar9[5].field_0.f;
          if (numparam < 7) {
            pVVar9 = defaultparam->Array;
            if (pVVar9[6].field_0.field_3.Type != '\x01') {
              pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003dbf2e;
            }
          }
          else {
            pVVar9 = param;
            if (param[6].field_0.field_3.Type != '\x01') {
              pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dbf2e:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x152b,
                            "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          zofs = pVVar9[6].field_0.f;
          if (numparam < 8) {
            pVVar9 = defaultparam->Array;
            if (pVVar9[7].field_0.field_3.Type != '\x01') {
              pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003dbf4d;
            }
          }
          else {
            pVVar9 = param;
            if (param[7].field_0.field_3.Type != '\x01') {
              pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dbf4d:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x152c,
                            "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          pvVar1 = pVVar9[7].field_0.field_1.a;
          if (numparam < 9) {
            pVVar9 = defaultparam->Array;
            if (pVVar9[8].field_0.field_3.Type != '\0') {
              pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003dbf6c;
            }
          }
          else {
            pVVar9 = param;
            if (param[8].field_0.field_3.Type != '\0') {
              pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003dbf6c:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x152d,
                            "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          flags = pVVar9[8].field_0.i;
          if (numparam < 10) {
            if (defaultparam->Array[9].field_0.field_3.Type != '\0') {
              pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003dbf94;
            }
            pos = defaultparam->Array[9].field_0.i;
          }
          else {
            if (param[9].field_0.field_3.Type != '\0') {
              pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003dbf94:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x152e,
                            "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pos = param[9].field_0.i;
          }
          if ((defactor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
            iVar6 = (**(defactor->super_DThinker).super_DObject._vptr_DObject)(defactor);
            (defactor->super_DThinker).super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var_00,iVar6);
          }
          val = FStateLabelStorage::GetState
                          (&StateLabels,pos,
                           (PClassActor *)(defactor->super_DThinker).super_DObject.Class,false);
          if (numparam < 0xb) {
            pVVar9 = defaultparam->Array;
            if (pVVar9[10].field_0.field_3.Type != '\x01') {
              pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003dbfb3;
            }
          }
          else {
            pVVar9 = param;
            if (param[10].field_0.field_3.Type != '\x01') {
              pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dbfb3:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x152f,
                            "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          heightoffset = pVVar9[10].field_0.f;
          if (numparam < 0xc) {
            pVVar9 = defaultparam->Array;
            if (pVVar9[0xb].field_0.field_3.Type != '\x01') {
              pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003dbfd2;
            }
          }
          else {
            pVVar9 = param;
            if (param[0xb].field_0.field_3.Type != '\x01') {
              pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dbfd2:
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1530,
                            "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          radiusoffset = pVVar9[0xb].field_0.f;
          if (numparam < 0xd) {
            param = defaultparam->Array;
            if (param[0xc].field_0.field_3.Type != '\x01') {
              pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003dbff1;
            }
          }
          else if (param[0xc].field_0.field_3.Type != '\x01') {
            pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003dbff1:
            __assert_fail(pcVar10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1531,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pvVar2 = param[0xc].field_0.field_1.a;
          if (1 < numret) {
            if (ret[1].RegType != '\0') goto LAB_003dbeca;
            *(undefined4 *)ret[1].Location = 0;
            numret = 2;
          }
          if (0 < numret) {
            VMReturn::SetPointer(ret,(void *)0x0,0);
          }
          if ((flags >> 0xd & 1) == 0) {
            reference = COPY_AAPTR(defactor,iVar5);
          }
          else {
            reference = SingleActorFromTID(iVar5,defactor);
          }
          if (reference != (AActor *)0x0) {
            local_40.Degrees = (double)pvVar2;
            local_38.Degrees = (double)pvVar1;
            iVar5 = P_Thing_Warp(defactor,reference,xofs,yofs,zofs,&local_38,flags,heightoffset,
                                 radiusoffset,&local_40);
            if (iVar5 != 0) {
              if (val == (FState *)0x0) {
                if (1 < numret) {
                  if (ret[1].RegType != '\0') {
LAB_003dbeca:
                    __assert_fail("RegType == REGT_INT",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                  ,0x13f,"void VMReturn::SetInt(int)");
                  }
                  *(undefined4 *)ret[1].Location = 1;
                }
              }
              else if (0 < numret) {
                VMReturn::SetPointer(ret,val,0);
              }
            }
          }
          return numret;
        }
        pcVar10 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_003dbeb2;
      }
    }
  }
  pcVar10 = "(paramnum) < numparam";
LAB_003dbeb2:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1527,"int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Warp)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(destination_selector);
	PARAM_FLOAT_DEF(xofs)				
	PARAM_FLOAT_DEF(yofs)				
	PARAM_FLOAT_DEF(zofs)				
	PARAM_ANGLE_DEF(angle)				
	PARAM_INT_DEF(flags)				
	PARAM_STATE_DEF(success_state)		
	PARAM_FLOAT_DEF(heightoffset)		
	PARAM_FLOAT_DEF(radiusoffset)		
	PARAM_ANGLE_DEF(pitch)				
	
	AActor *reference;

	// A_Teleport and A_Warp were the only codepointers that can state jump
	// *AND* have a meaningful inventory state chain result. Grrr.
	if (numret > 1)
	{
		ret[1].SetInt(false);
		numret = 2;
	}
	if (numret > 0)
	{
		ret[0].SetPointer(NULL, ATAG_STATE);
	}

	if ((flags & WARPF_USETID))
	{
		reference = SingleActorFromTID(destination_selector, self);
	}
	else
	{
		reference = COPY_AAPTR(self, destination_selector);
	}

	//If there is no actor to warp to, fail.
	if (!reference)
	{
		return numret;
	}

	if (P_Thing_Warp(self, reference, xofs, yofs, zofs, angle, flags, heightoffset, radiusoffset, pitch))
	{
		if (success_state)
		{
			// Jumps should never set the result for inventory state chains!
			// in this case, you have the statejump to help you handle all the success anyway.
			if (numret > 0)
			{
				ret[0].SetPointer(success_state, ATAG_STATE);
			}
		}
		else if (numret > 1)
		{
			ret[1].SetInt(true);
		}
	}
	return numret;
}